

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O0

void SpookyHash::Short(void *message,size_t length,uint64 *hash1,uint64 *hash2)

{
  long *in_RCX;
  long *in_RDX;
  ulong in_RSI;
  uint64 *in_RDI;
  uint64 *end;
  uint64 d;
  uint64 c;
  uint64 b;
  uint64 a;
  size_t remainder;
  anon_union_8_4_fb546f3f u;
  uint64 buf [12];
  uint64 *in_stack_ffffffffffffff38;
  uint64 *in_stack_ffffffffffffff40;
  uint64 *puVar1;
  uint64 *h0;
  long local_a8;
  long local_a0;
  uint64 *local_98;
  uint64 *local_90;
  
  local_98 = (uint64 *)(in_RSI & 0x1f);
  local_a0 = *in_RDX;
  local_a8 = *in_RCX;
  h0 = (uint64 *)0xdeadbeefdeadbeef;
  puVar1 = (uint64 *)0xdeadbeefdeadbeef;
  local_90 = in_RDI;
  if (0xf < in_RSI) {
    in_stack_ffffffffffffff40 = (uint64 *)((long)in_RDI + (in_RSI & 0xffffffffffffffe0));
    for (; local_90 < in_stack_ffffffffffffff40; local_90 = local_90 + 4) {
      h0 = (uint64 *)(*local_90 + (long)h0);
      puVar1 = (uint64 *)(local_90[1] + (long)puVar1);
      ShortMix(h0,puVar1,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_a0 = local_90[2] + local_a0;
      local_a8 = local_90[3] + local_a8;
    }
    if ((uint64 *)0xf < local_98) {
      h0 = (uint64 *)(*local_90 + (long)h0);
      ShortMix(h0,(uint64 *)(local_90[1] + (long)puVar1),in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
      local_90 = local_90 + 2;
      local_98 = local_98 + -2;
    }
  }
  puVar1 = (uint64 *)(in_RSI << 0x38);
  switch(local_98) {
  case (uint64 *)0x0:
    h0 = (uint64 *)((long)h0 + -0x2152411021524111);
    puVar1 = (uint64 *)((long)puVar1 + -0x2152411021524111);
    break;
  case (uint64 *)0x3:
    h0 = h0 + (ulong)*(byte *)((long)local_90 + 2) * 0x2000;
  case (uint64 *)0x2:
    h0 = h0 + (ulong)*(byte *)((long)local_90 + 1) * 0x20;
  case (uint64 *)0x1:
    h0 = (uint64 *)((ulong)(byte)*local_90 + (long)h0);
    break;
  case (uint64 *)0x7:
    h0 = (uint64 *)(((ulong)*(byte *)((long)local_90 + 6) << 0x30) + (long)h0);
  case (uint64 *)0x6:
    h0 = (uint64 *)(((ulong)*(byte *)((long)local_90 + 5) << 0x28) + (long)h0);
  case (uint64 *)0x5:
    h0 = (uint64 *)(((ulong)*(byte *)((long)local_90 + 4) << 0x20) + (long)h0);
  case (uint64 *)0x4:
    h0 = (uint64 *)((ulong)(uint)*local_90 + (long)h0);
    break;
  case (uint64 *)0xb:
    puVar1 = puVar1 + (ulong)*(byte *)((long)local_90 + 10) * 0x2000;
  case (uint64 *)0xa:
    puVar1 = puVar1 + (ulong)*(byte *)((long)local_90 + 9) * 0x20;
  case (uint64 *)0x9:
    puVar1 = (uint64 *)((ulong)(byte)local_90[1] + (long)puVar1);
  case (uint64 *)0x8:
    h0 = (uint64 *)(*local_90 + (long)h0);
    break;
  case (uint64 *)0xf:
    puVar1 = (uint64 *)(((ulong)*(byte *)((long)local_90 + 0xe) << 0x30) + (long)puVar1);
  case (uint64 *)0xe:
    puVar1 = (uint64 *)(((ulong)*(byte *)((long)local_90 + 0xd) << 0x28) + (long)puVar1);
  case (uint64 *)0xd:
    puVar1 = (uint64 *)(((ulong)*(byte *)((long)local_90 + 0xc) << 0x20) + (long)puVar1);
  case (uint64 *)0xc:
    puVar1 = (uint64 *)((ulong)(uint)local_90[1] + (long)puVar1);
    h0 = (uint64 *)(*local_90 + (long)h0);
  }
  ShortEnd(h0,puVar1,in_stack_ffffffffffffff40,local_98);
  *in_RDX = local_a0;
  *in_RCX = local_a8;
  return;
}

Assistant:

void SpookyHash::Short(
    const void *message,
    size_t length,
    uint64 *hash1,
    uint64 *hash2)
{
    uint64 buf[sc_numVars];
    union 
    { 
        const uint8 *p8; 
        uint32 *p32;
        uint64 *p64; 
        size_t i; 
    } u;

    u.p8 = (const uint8 *)message;
    
    if (!ALLOW_UNALIGNED_READS && (u.i & 0x7))
    {
        memcpy(buf, message, length);
        u.p64 = buf;
    }

    size_t remainder = length%32;
    uint64 a=*hash1;
    uint64 b=*hash2;
    uint64 c=sc_const;
    uint64 d=sc_const;

    if (length > 15)
    {
        const uint64 *end = u.p64 + (length/32)*4;
        
        // handle all complete sets of 32 bytes
        for (; u.p64 < end; u.p64 += 4)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            a += u.p64[2];
            b += u.p64[3];
        }
        
        //Handle the case of 16+ remaining bytes.
        if (remainder >= 16)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            u.p64 += 2;
            remainder -= 16;
        }
    }
    
    // Handle the last 0..15 bytes, and its length
    d = ((uint64)length) << 56;
    switch (remainder)
    {
    case 15:
    d += ((uint64)u.p8[14]) << 48;
    case 14:
        d += ((uint64)u.p8[13]) << 40;
    case 13:
        d += ((uint64)u.p8[12]) << 32;
    case 12:
        d += u.p32[2];
        c += u.p64[0];
        break;
    case 11:
        d += ((uint64)u.p8[10]) << 16;
    case 10:
        d += ((uint64)u.p8[9]) << 8;
    case 9:
        d += (uint64)u.p8[8];
    case 8:
        c += u.p64[0];
        break;
    case 7:
        c += ((uint64)u.p8[6]) << 48;
    case 6:
        c += ((uint64)u.p8[5]) << 40;
    case 5:
        c += ((uint64)u.p8[4]) << 32;
    case 4:
        c += u.p32[0];
        break;
    case 3:
        c += ((uint64)u.p8[2]) << 16;
    case 2:
        c += ((uint64)u.p8[1]) << 8;
    case 1:
        c += (uint64)u.p8[0];
        break;
    case 0:
        c += sc_const;
        d += sc_const;
    }
    ShortEnd(a,b,c,d);
    *hash1 = a;
    *hash2 = b;
}